

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcZone::~IfcZone(IfcZone *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0x88db20;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0x88db98;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0x88 = 0x88db48;
  (this->super_IfcGroup).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0x88db70;
  puVar2 = *(undefined1 **)
            &(this->super_IfcGroup).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  puVar1 = &(this->super_IfcGroup).super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0x88dc38;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0x88dc60;
  puVar2 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x60;
  puVar1 = &(this->super_IfcGroup).super_IfcObject.field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x38;
  puVar1 = &(this->super_IfcGroup).super_IfcObject.field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcGroup).super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
    return;
  }
  return;
}

Assistant:

IfcZone() : Object("IfcZone") {}